

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O1

void __thiscall
HermiteSpline<3U,_2U>::walk
          (HermiteSpline<3U,_2U> *this,double deltatau,
          _func_void_VectorNd_HermiteSpline<3U,_2U>_ptr_double_Polynomial_ptr_void_ptr *fn,
          void *payload)

{
  double *pdVar1;
  bool bVar2;
  pointer pUVar3;
  pointer pUVar4;
  pointer pUVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  VectorNd VVar14;
  VectorNd pt;
  HermiteSpline<3U,_2U> local_58;
  
  pUVar4 = (this->children).
           super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pUVar4) {
    uVar9 = 0;
    dVar11 = 0.0;
    do {
      pUVar4 = pUVar4 + uVar9;
      VVar14.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
           = dVar11 / pUVar4->length;
      pUVar5 = pUVar4;
      lVar6 = 0;
      do {
        pUVar3 = (pointer)0x0;
        lVar8 = 0;
        dVar12 = 1.0;
        do {
          dVar13 = VVar14.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                   m_data.array[0] * dVar12;
          pUVar3 = (pointer)((double)pUVar3 + dVar12 * pUVar5->_dims[0].coeffs[lVar8]);
          lVar8 = lVar8 + 1;
          dVar12 = dVar13;
        } while (lVar8 != 4);
        (&local_58.children.
          super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)[lVar6] = pUVar3;
        pUVar5 = (pointer)(pUVar5->_dims + 1);
        bVar10 = lVar6 == 0;
        lVar6 = lVar6 + 1;
      } while (bVar10);
      local_58.children.
      super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_58.children.
           super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58.children.
      super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_58.length;
      VVar14.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
           = (double)local_58.children.
                     super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (*fn)(VVar14,&local_58,dVar13,(Polynomial *)this,pUVar4);
      dVar12 = dVar11 + deltatau;
      pdVar1 = &(this->children).
                super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar9].length;
      bVar10 = dVar12 != *pdVar1;
      bVar2 = *pdVar1 <= dVar12;
      dVar11 = 0.0;
      if (!bVar2 || !bVar10) {
        dVar11 = dVar12;
      }
      uVar9 = (ulong)((int)uVar9 + (uint)(bVar2 && bVar10));
      pUVar4 = (this->children).
               super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(this->children).
                     super__Vector_base<UnitBoundedPolynomial<3U,_2U>,_std::allocator<UnitBoundedPolynomial<3U,_2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4 >> 3) *
              -0x71c71c71c71c71c7;
    } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
  }
  return;
}

Assistant:

void HermiteSpline<Order, Dims>::walk(const double deltatau, void (*fn)(VectorNd, HermiteSpline<Order, Dims>&, double, UnitBoundedPolynomial<Order, Dims>&, void *), void *payload)
{
    double tau = 0.0;
    int m = 0;

    while (m < children.size())
    {
        double reltau = tau / children[m].length;
        VectorNd pt = children[m].interpolate(reltau);

        fn(pt, *this, reltau, children[m], payload);
        tau += deltatau;

        if (tau > children[m].length)
        {
            tau = 0.0;
            m++;
        }
    }
}